

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Cube::setupFrontFace(Cube *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = this->x;
  fVar2 = this->y;
  fVar3 = this->z + this->b;
  fVar4 = this->l + fVar1;
  fVar5 = this->h + fVar2;
  this->positionData[0] = fVar1;
  this->positionData[1] = fVar2;
  this->positionData[2] = fVar3;
  this->positionData[3] = fVar4;
  this->positionData[4] = fVar2;
  this->positionData[5] = fVar3;
  this->positionData[6] = fVar4;
  this->positionData[7] = fVar5;
  this->positionData[8] = fVar3;
  this->positionData[9] = fVar4;
  this->positionData[10] = fVar5;
  this->positionData[0xb] = fVar3;
  this->positionData[0xc] = fVar1;
  this->positionData[0xd] = fVar2;
  this->positionData[0xe] = fVar3;
  this->positionData[0xf] = fVar1;
  this->positionData[0x10] = fVar5;
  this->positionData[0x11] = fVar3;
  return;
}

Assistant:

void setupFrontFace() {
        float frontFace[]={
            x,y,z+b,
            x+l,y,z+b,
            x+l,y+h,z+b,
            x+l,y+h,z+b,
            x,y,z+b,
            x,y+h,z+b

        };

        arrayCopy(frontFace,positionData,0);
    }